

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall HVectorBase<HighsCDouble>::reIndex(HVectorBase<HighsCDouble> *this)

{
  int iVar1;
  pointer piVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  
  if ((this->count < 0) || ((double)this->size * 0.1 < (double)this->count)) {
    this->count = 0;
    piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = &((this->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl
               .super__Vector_impl_data._M_start)->lo;
    for (lVar4 = 0; lVar4 < this->size; lVar4 = lVar4 + 1) {
      dVar5 = ((HighsCDouble *)(pdVar3 + -1))->hi + *pdVar3;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        iVar1 = this->count;
        this->count = iVar1 + 1;
        piVar2[iVar1] = (int)lVar4;
      }
      pdVar3 = pdVar3 + 2;
    }
  }
  return;
}

Assistant:

void HVectorBase<Real>::reIndex() {
  /*
   * Possibly determine the indices from scratch by passing through
   * the array
   */
  // Don't do it if there are relatively few nonzeros
  if (count >= 0 && count <= size * 0.1) return;
  count = 0;
  for (HighsInt i = 0; i < size; i++)
    if ((double)array[i]) index[count++] = i;
}